

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::LRNLayerParams::LRNLayerParams(LRNLayerParams *this,LRNLayerParams *from)

{
  uint64_t uVar1;
  float fVar2;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__LRNLayerParams_003fe288;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  this->k_ = from->k_;
  fVar2 = from->beta_;
  uVar1 = from->localsize_;
  this->alpha_ = from->alpha_;
  this->beta_ = fVar2;
  this->localsize_ = uVar1;
  return;
}

Assistant:

LRNLayerParams::LRNLayerParams(const LRNLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::memcpy(&alpha_, &from.alpha_,
    static_cast<size_t>(reinterpret_cast<char*>(&k_) -
    reinterpret_cast<char*>(&alpha_)) + sizeof(k_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.LRNLayerParams)
}